

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e mode)

{
  ZSTD_sequenceCopier sequenceCopier;
  code *pcStack_10;
  ZSTD_sequenceFormat_e mode_local;
  
  if (mode == ZSTD_sf_explicitBlockDelimiters) {
    pcStack_10 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
  }
  else if (mode == ZSTD_sf_noBlockDelimiters) {
    pcStack_10 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
  }
  else {
    pcStack_10 = (ZSTD_sequenceCopier)0x0;
  }
  return pcStack_10;
}

Assistant:

static ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e mode) {
    ZSTD_sequenceCopier sequenceCopier = NULL;
    assert(ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode));
    if (mode == ZSTD_sf_explicitBlockDelimiters) {
        return ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    } else if (mode == ZSTD_sf_noBlockDelimiters) {
        return ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    assert(sequenceCopier != NULL);
    return sequenceCopier;
}